

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O3

void gflags::anon_unknown_5::Test_FlagsValidator_FlagSaver::Run(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  undefined8 extraout_RAX;
  char *value;
  FlagSaver fs_1;
  FlagSaver fs;
  FlagSaver FStack_48;
  FlagSaver local_40;
  string local_38;
  
  FlagSaver::FlagSaver(&local_40);
  value = "FlagSaver";
  fprintf(_stderr,"Running test %s/%s\n","FlagsValidator");
  FlagSaver::FlagSaver(&FStack_48);
  bVar2 = RegisterFlagValidator(&(anonymous_namespace)::fLI::FLAGS_test_flag,ValidateTestFlagIs5);
  if (bVar2) {
    SetCommandLineOption_abi_cxx11_(&local_38,(gflags *)0x1512be,"50",value);
    iVar3 = std::__cxx11::string::compare((char *)&local_38);
    paVar1 = &local_38.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar1) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    if (iVar3 != 0) goto LAB_0013b771;
    FlagSaver::~FlagSaver(&FStack_48);
    SetCommandLineOption_abi_cxx11_(&local_38,(gflags *)0x1512be,"50",value);
    iVar3 = std::__cxx11::string::compare((char *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar1) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    if (iVar3 == 0) goto LAB_0013b776;
    bVar2 = RegisterFlagValidator(&(anonymous_namespace)::fLI::FLAGS_test_flag,ValidateTestFlagIs5);
    if (!bVar2) goto LAB_0013b77b;
    FlagSaver::FlagSaver(&FStack_48);
    bVar2 = RegisterFlagValidator
                      (&(anonymous_namespace)::fLI::FLAGS_test_flag,(_func_bool_char_ptr_int32 *)0x0
                      );
    if (!bVar2) goto LAB_0013b780;
    SetCommandLineOption_abi_cxx11_(&local_38,(gflags *)0x1512be,"50",value);
    iVar3 = std::__cxx11::string::compare((char *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar1) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    if (iVar3 != 0) {
      FlagSaver::~FlagSaver(&FStack_48);
      SetCommandLineOption_abi_cxx11_(&local_38,(gflags *)0x1512be,"50",value);
      iVar3 = std::__cxx11::string::compare((char *)&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != paVar1) {
        operator_delete(local_38._M_dataplus._M_p);
      }
      if (iVar3 == 0) {
        FlagSaver::~FlagSaver(&local_40);
        return;
      }
      goto LAB_0013b78a;
    }
  }
  else {
    _GLOBAL__N_1::Test_FlagsValidator_FlagSaver::Run();
LAB_0013b771:
    _GLOBAL__N_1::Test_FlagsValidator_FlagSaver::Run();
LAB_0013b776:
    _GLOBAL__N_1::Test_FlagsValidator_FlagSaver::Run();
LAB_0013b77b:
    _GLOBAL__N_1::Test_FlagsValidator_FlagSaver::Run();
LAB_0013b780:
    _GLOBAL__N_1::Test_FlagsValidator_FlagSaver::Run();
  }
  _GLOBAL__N_1::Test_FlagsValidator_FlagSaver::Run();
LAB_0013b78a:
  _GLOBAL__N_1::Test_FlagsValidator_FlagSaver::Run();
  FlagSaver::~FlagSaver(&FStack_48);
  FlagSaver::~FlagSaver(&local_40);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(FlagsValidator, FlagSaver) {
  {
    FlagSaver fs;
    EXPECT_TRUE(RegisterFlagValidator(&FLAGS_test_flag, &ValidateTestFlagIs5));
    EXPECT_EQ("", SetCommandLineOption("test_flag", "50"));  // fails validation
  }
  EXPECT_NE("", SetCommandLineOption("test_flag", "50"));  // validator is gone

  EXPECT_TRUE(RegisterFlagValidator(&FLAGS_test_flag, &ValidateTestFlagIs5));
  {
    FlagSaver fs;
    EXPECT_TRUE(RegisterFlagValidator(&FLAGS_test_flag, NULL));
    EXPECT_NE("", SetCommandLineOption("test_flag", "50"));  // no validator
  }
  EXPECT_EQ("", SetCommandLineOption("test_flag", "50"));  // validator is back
}